

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputFile.cpp
# Opt level: O0

void __thiscall OutputFile::OutputFile(OutputFile *this)

{
  allocator<char> local_25 [20];
  allocator<char> local_11;
  OutputFile *local_10;
  OutputFile *this_local;
  
  local_10 = this;
  std::__cxx11::list<OutputFile_*,_std::allocator<OutputFile_*>_>::list(&this->descendants);
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::string((string *)&this->version);
  std::__cxx11::string::string((string *)&this->key);
  std::__cxx11::string::string((string *)&this->value);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->eol,"\n",&local_11);
  std::allocator<char>::~allocator(&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->keySeparator,"::",local_25);
  std::allocator<char>::~allocator(local_25);
  return;
}

Assistant:

OutputFile::OutputFile(void) : eol("\n"), keySeparator("::") {}